

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_get_length(wally_tx *tx,uint32_t flags,size_t *written)

{
  int iVar1;
  size_t is_elements;
  
  is_elements = 0;
  iVar1 = wally_tx_is_elements(tx,&is_elements);
  if (iVar1 == 0) {
    iVar1 = tx_get_length(tx,(tx_serialize_opts *)0x0,flags,written,is_elements != 0);
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int wally_tx_get_length(const struct wally_tx *tx, uint32_t flags,
                        size_t *written)
{
    size_t is_elements = 0;
#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif

    return tx_get_length(tx, NULL, flags, written, is_elements != 0);
}